

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O0

int htmlSaveFile(char *filename,xmlDocPtr cur)

{
  xmlChar *encoding_00;
  xmlCharEncodingHandler *encoder;
  xmlOutputBufferPtr buf_00;
  int ret;
  char *encoding;
  xmlCharEncodingHandlerPtr handler;
  xmlOutputBufferPtr buf;
  xmlDocPtr cur_local;
  char *filename_local;
  
  if ((cur == (xmlDocPtr)0x0) || (filename == (char *)0x0)) {
    filename_local._4_4_ = -1;
  }
  else {
    xmlInitParser();
    encoding_00 = htmlGetMetaEncoding(cur);
    encoder = htmlFindOutputEncoder((char *)encoding_00);
    buf_00 = xmlOutputBufferCreateFilename(filename,encoder,cur->compression);
    if (buf_00 == (xmlOutputBufferPtr)0x0) {
      filename_local._4_4_ = 0;
    }
    else {
      htmlDocContentDumpOutput(buf_00,cur,(char *)0x0);
      filename_local._4_4_ = xmlOutputBufferClose(buf_00);
    }
  }
  return filename_local._4_4_;
}

Assistant:

int
htmlSaveFile(const char *filename, xmlDocPtr cur) {
    xmlOutputBufferPtr buf;
    xmlCharEncodingHandlerPtr handler = NULL;
    const char *encoding;
    int ret;

    if ((cur == NULL) || (filename == NULL))
        return(-1);

    xmlInitParser();

    encoding = (const char *) htmlGetMetaEncoding(cur);
    handler = htmlFindOutputEncoder(encoding);
    buf = xmlOutputBufferCreateFilename(filename, handler, cur->compression);
    if (buf == NULL)
        return(0);

    htmlDocContentDumpOutput(buf, cur, NULL);

    ret = xmlOutputBufferClose(buf);
    return(ret);
}